

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckHandler::TestOutputFileNames
          (cmCTestMemCheckHandler *this,int test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_448 [32];
  undefined1 local_428 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_2b0 [8];
  string log_1;
  string local_288 [32];
  undefined1 local_268 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_f0 [8];
  string log;
  Glob g;
  size_type pos;
  undefined1 local_60 [8];
  string ofile;
  string index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  int test_local;
  cmCTestMemCheckHandler *this_local;
  
  std::__cxx11::to_string((string *)((long)&ofile.field_2 + 8),test);
  std::__cxx11::string::string((string *)local_60,(string *)&this->MemoryTesterOutputFile);
  uVar3 = std::__cxx11::string::find(local_60,0xd16a44);
  std::__cxx11::string::replace((ulong)local_60,uVar3,(string *)0x2);
  if ((this->LogWithPID & 1U) == 0) {
    bVar2 = cmsys::SystemTools::FileExists((string *)local_60);
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     "Cannot find memory tester output file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
      poVar5 = std::operator<<((ostream *)local_428,(string *)local_2b0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x587,pcVar6,false);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)local_2b0);
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)local_60,".*");
    cmsys::Glob::Glob((Glob *)((long)&log.field_2 + 8));
    cmsys::Glob::FindFiles((Glob *)((long)&log.field_2 + 8),(string *)local_60,(GlobMessages *)0x0);
    pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&log.field_2 + 8));
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar4);
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "Cannot find memory tester output file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      poVar5 = std::operator<<((ostream *)local_268,(string *)local_f0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x57f,pcVar6,false);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)local_f0);
    }
    else {
      pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&log.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(files,pvVar4);
    }
    log_1.field_2._13_3_ = 0;
    log_1.field_2._M_local_buf[0xc] = !bVar2;
    cmsys::Glob::~Glob((Glob *)((long)&log.field_2 + 8));
    if (log_1.field_2._12_4_ != 0) goto LAB_001f2777;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(files,(value_type *)local_60);
  log_1.field_2._12_4_ = 0;
LAB_001f2777:
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(ofile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmCTestMemCheckHandler::TestOutputFileNames(
  int test, std::vector<std::string>& files)
{
  std::string index = std::to_string(test);
  std::string ofile = this->MemoryTesterOutputFile;
  std::string::size_type pos = ofile.find("??");
  ofile.replace(pos, 2, index);
  if (this->LogWithPID) {
    ofile += ".*";
    cmsys::Glob g;
    g.FindFiles(ofile);
    if (g.GetFiles().empty()) {
      std::string log = "Cannot find memory tester output file: " + ofile;
      cmCTestLog(this->CTest, WARNING, log << std::endl);
      ofile.clear();
    } else {
      files = g.GetFiles();
      return;
    }
  } else if (!cmSystemTools::FileExists(ofile)) {
    std::string log = "Cannot find memory tester output file: " + ofile;
    cmCTestLog(this->CTest, WARNING, log << std::endl);
    ofile.clear();
  }
  files.push_back(std::move(ofile));
}